

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void __thiscall aim_t::AimTraverse(aim_t *this)

{
  double *pdVar1;
  secplane_t *psVar2;
  sector_t *psVar3;
  line_t *line;
  AActor *ac;
  DAngle DVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  xfloor *this_00;
  F3DFloor **ppFVar10;
  intercept_t *in_00;
  divline_t *pdVar11;
  MetaClass *pMVar12;
  char *pcVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  sector_t *local_420;
  sector_t *local_418;
  byte local_3a9;
  byte local_399;
  TAngle<double> local_398;
  TAngle<double> local_390;
  TAngle<double> local_388;
  TFlags<ActorFlag3,_unsigned_int> local_37c;
  TAngle<double> local_378;
  double local_370;
  double d3;
  double local_358;
  double tracelen;
  double cosine;
  TAngle<double> local_340;
  TAngle<double> local_338;
  TAngle<double> local_330;
  TAngle<double> local_328;
  TAngle<double> local_320;
  TAngle<double> local_318;
  TAngle<double> local_310;
  TAngle<double> local_308;
  TAngle<double> local_300;
  TAngle<double> local_2f8 [2];
  TAngle<double> local_2e8;
  TAngle<double> local_2e0 [2];
  TAngle<double> local_2d0;
  TAngle<double> local_2c8 [2];
  TAngle<double> local_2b8;
  DAngle pitch_2;
  double ff_bottom;
  TAngle<double> local_298;
  DAngle pitch_1;
  double ff_top;
  TFlags<ActorFlag3,_unsigned_int> local_280;
  TFlags<ActorFlag,_unsigned_int> local_27c;
  TAngle<double> local_278;
  TAngle<double> local_270;
  TAngle<double> local_268;
  TAngle<double> local_260;
  TAngle<double> local_258;
  TAngle<double> local_250;
  TAngle<double> local_248;
  TAngle<double> local_240;
  sector_t *local_238;
  sector_t *exitsec;
  sector_t *entersec;
  int planestocheck;
  TAngle<double> local_218 [2];
  TAngle<double> local_208;
  TAngle<double> local_200 [2];
  TAngle<double> local_1f0;
  undefined1 local_1e8 [24];
  FLineOpening open;
  int frontflag;
  DAngle thingpitch;
  double dist;
  DAngle thingbottompitch;
  DAngle thingtoppitch;
  DAngle pitch;
  AActor *th;
  line_t *li;
  intercept_t *in;
  FPathTraverse it;
  TAngle<double> local_98;
  TAngle<double> local_90;
  TAngle<double> local_88;
  TAngle<double> local_80;
  TAngle<double> local_78;
  TAngle<double> local_70;
  TAngle<double> local_68;
  TVector2<double> local_60;
  TVector2<double> local_50;
  double local_40;
  double bottomz;
  F3DFloor *rover;
  iterator __end1;
  iterator __begin1;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range1;
  bool floorportalstate;
  bool ceilingportalstate;
  aim_t *this_local;
  
  AimTarget::Clear(&this->linetarget);
  AimTarget::Clear(&this->thing_friend);
  AimTarget::Clear(&this->thing_other);
  uVar7 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                    ((TArray<F3DFloor_*,_F3DFloor_*> *)&this->lastsector->e->XFloor);
  this->crossedffloors = uVar7 != 0;
  this->lastceilingplane = (secplane_t *)0x0;
  this->lastfloorplane = (secplane_t *)0x0;
  local_399 = 0;
  if ((this->aimdir & 1U) != 0) {
    bVar5 = TAngle<double>::operator<(&this->toppitch,0.0);
    local_399 = 0;
    if (bVar5) {
      bVar5 = sector_t::PortalBlocksMovement(this->lastsector,1);
      local_399 = bVar5 ^ 0xff;
    }
  }
  __range1._7_1_ = local_399 & 1;
  local_3a9 = 0;
  if ((this->aimdir & 2U) != 0) {
    bVar5 = TAngle<double>::operator>(&this->bottompitch,0.0);
    local_3a9 = 0;
    if (bVar5) {
      bVar5 = sector_t::PortalBlocksMovement(this->lastsector,0);
      local_3a9 = bVar5 ^ 0xff;
    }
  }
  __range1._6_1_ = local_3a9 & 1;
  this_00 = &this->lastsector->e->XFloor;
  __end1 = TArray<F3DFloor_*,_F3DFloor_*>::begin((TArray<F3DFloor_*,_F3DFloor_*> *)this_00);
  rover = (F3DFloor *)TArray<F3DFloor_*,_F3DFloor_*>::end((TArray<F3DFloor_*,_F3DFloor_*> *)this_00)
  ;
  while (bVar5 = TIterator<F3DFloor_*>::operator!=(&__end1,(TIterator<F3DFloor_*> *)&rover), bVar5)
  {
    ppFVar10 = TIterator<F3DFloor_*>::operator*(&__end1);
    bottomz = (double)*ppFVar10;
    if (((((F3DFloor *)bottomz)->flags & 0x4000000) == 0) &&
       ((((F3DFloor *)bottomz)->flags & 1) != 0)) {
      psVar2 = (((F3DFloor *)bottomz)->bottom).plane;
      TVector2<double>::TVector2(&local_50,&this->startpos);
      local_40 = secplane_t::ZatPoint(psVar2,&local_50);
      if ((this->startpos).Z + this->shootthing->Height <= local_40) {
        this->lastceilingplane = *(secplane_t **)bottomz;
        __range1._7_1_ = 0;
      }
      psVar2 = *(secplane_t **)((long)bottomz + 0x28);
      TVector2<double>::TVector2(&local_60,&this->startpos);
      local_40 = secplane_t::ZatPoint(psVar2,&local_60);
      if (local_40 <= (this->startpos).Z) {
        this->lastfloorplane = *(secplane_t **)((long)bottomz + 0x28);
        __range1._6_1_ = 0;
      }
    }
    TIterator<F3DFloor_*>::operator++(&__end1);
  }
  if (__range1._7_1_ != 0) {
    psVar3 = this->lastsector;
    TAngle<double>::TAngle(&local_68,&this->toppitch);
    TAngle<double>::TAngle(&local_78,0.0);
    TAngle<double>::TAngle(&local_80,&this->bottompitch);
    MIN<TAngle<double>>(&local_70,&local_78);
    EnterSectorPortal(this,1,0.0,psVar3,&local_68,&local_70);
  }
  if (__range1._6_1_ != 0) {
    psVar3 = this->lastsector;
    TAngle<double>::TAngle(&local_90,0.0);
    TAngle<double>::TAngle(&local_98,&this->toppitch);
    MAX<TAngle<double>>(&local_88,&local_90);
    TAngle<double>::TAngle((TAngle<double> *)&it.count,&this->bottompitch);
    EnterSectorPortal(this,0,0.0,psVar3,&local_88,(DAngle *)&it.count);
  }
  FPathTraverse::FPathTraverse
            ((FPathTraverse *)&in,(this->startpos).X,(this->startpos).Y,(this->aimtrace).X,
             (this->aimtrace).Y,0xf,this->startfrac);
  bVar5 = FBoolCVar::operator_cast_to_bool(&aimdebug);
  if (bVar5) {
    Printf("Start AimTraverse, start = %f,%f,%f, vect = %f,%f\n",
           (this->startpos).X * 1.52587890625e-05,(this->startpos).Y * 1.52587890625e-05,
           (this->startpos).Z * 1.52587890625e-05,(this->aimtrace).X * 1.52587890625e-05,
           (this->aimtrace).Y * 1.52587890625e-05);
  }
LAB_00682555:
  do {
    while( true ) {
      in_00 = FPathTraverse::Next((FPathTraverse *)&in);
      if (in_00 == (intercept_t *)0x0) goto LAB_00683dcd;
      TAngle<double>::TAngle(&thingtoppitch);
      TAngle<double>::TAngle(&thingbottompitch);
      TAngle<double>::TAngle((TAngle<double> *)&dist);
      TAngle<double>::TAngle((TAngle<double> *)&frontflag);
      if (((this->linetarget).super_FTranslatedLineTarget.linetarget != (AActor *)0x0) &&
         (pdVar1 = &(this->linetarget).frac, *pdVar1 <= in_00->frac && in_00->frac != *pdVar1))
      goto LAB_00683dcd;
      if ((in_00->isaline & 1U) == 0) break;
      line = (in_00->d).line;
      TVector2<double>::TVector2((TVector2<double> *)&open.floorterrain,&this->startpos);
      iVar8 = P_PointOnLineSidePrecise((DVector2 *)&open.floorterrain,line);
      bVar5 = FBoolCVar::operator_cast_to_bool(&aimdebug);
      if (bVar5) {
        Printf("Found line %d: ___toppitch = %f, ___bottompitch = %f\n",(this->toppitch).Degrees,
               (this->bottompitch).Degrees,
               (ulong)(uint)((int)((ulong)((long)line - (long)lines) >> 3) * 0x286bca1b));
      }
      bVar5 = line_t::isLinePortal(line);
      if ((bVar5) && (iVar8 == 0)) {
        EnterLinePortal(this,line,in_00->frac);
        goto LAB_00683dcd;
      }
      if (((line->flags & 4) == 0) || ((line->flags & 0x8000) != 0)) goto LAB_00683dcd;
      FLineOpening::FLineOpening((FLineOpening *)(local_1e8 + 0x10));
      FPathTraverse::InterceptPoint((FPathTraverse *)local_1e8,(intercept_t *)&in);
      P_LineOpening((FLineOpening *)(local_1e8 + 0x10),(AActor *)0x0,line,(DVector2 *)local_1e8,
                    (DVector2 *)0x0,0x100);
      if ((open.bottom <= 0.0) || ((double)local_1e8._16_8_ <= open.top)) goto LAB_00683dcd;
      thingpitch.Degrees = this->attackrange * in_00->frac;
      if ((open.top != -3.4028234663852886e+38) || (NAN(open.top))) {
        VecToAngle(thingpitch.Degrees,open.top - this->shootz);
        TAngle<double>::operator-(&local_1f0);
        TAngle<double>::operator=(&thingtoppitch,&local_1f0);
        TAngle<double>::TAngle(local_200,&this->bottompitch);
        bVar5 = TAngle<double>::operator<(&thingtoppitch,local_200);
        if (bVar5) {
          TAngle<double>::operator=(&this->bottompitch,&thingtoppitch);
        }
      }
      if (((double)local_1e8._16_8_ != 3.4028234663852886e+38) || (NAN((double)local_1e8._16_8_))) {
        VecToAngle(thingpitch.Degrees,(double)local_1e8._16_8_ - this->shootz);
        TAngle<double>::operator-(&local_208);
        TAngle<double>::operator=(&thingtoppitch,&local_208);
        TAngle<double>::TAngle(local_218,&this->toppitch);
        bVar5 = TAngle<double>::operator>(&thingtoppitch,local_218);
        if (bVar5) {
          TAngle<double>::operator=(&this->toppitch,&thingtoppitch);
        }
      }
      TAngle<double>::TAngle((TAngle<double> *)&stack0xfffffffffffffde0,&this->bottompitch);
      bVar5 = TAngle<double>::operator>=(&this->toppitch,(TAngle<double> *)&stack0xfffffffffffffde0)
      ;
      if (bVar5) goto LAB_00683dcd;
      pdVar11 = FPathTraverse::Trace((FPathTraverse *)&in);
      bVar5 = AimTraverse3DFloors(this,pdVar11,in_00,iVar8,(int *)((long)&entersec + 4));
      if (!bVar5) goto LAB_00683dcd;
      bVar5 = FBoolCVar::operator_cast_to_bool(&aimdebug);
      if (bVar5) {
        Printf("After line %d: toppitch = %f, bottompitch = %f, planestocheck = %d\n",
               (this->toppitch).Degrees,(this->bottompitch).Degrees,
               (ulong)(uint)((int)((ulong)((long)line - (long)lines) >> 3) * 0x286bca1b),
               (ulong)entersec._4_4_);
      }
      if (iVar8 == 0) {
        local_418 = line->backsector;
      }
      else {
        local_418 = line->frontsector;
      }
      exitsec = local_418;
      if (iVar8 == 0) {
        local_420 = line->frontsector;
      }
      else {
        local_420 = line->backsector;
      }
      local_238 = local_420;
      this->lastsector = local_418;
      if (((((entersec._4_4_ & 1) != 0) &&
           (bVar5 = TAngle<double>::operator<(&this->toppitch,0.0), bVar5)) &&
          (((double)local_1e8._16_8_ != 3.4028234663852886e+38 || (NAN((double)local_1e8._16_8_)))))
         && (bVar5 = sector_t::PortalBlocksMovement(exitsec,1), psVar3 = exitsec, !bVar5)) {
        dVar14 = in_00->frac;
        TAngle<double>::TAngle(&local_240,&this->toppitch);
        TAngle<double>::TAngle(&local_250,0.0);
        TAngle<double>::TAngle(&local_258,&this->bottompitch);
        MIN<TAngle<double>>(&local_248,&local_250);
        EnterSectorPortal(this,1,dVar14,psVar3,&local_240,&local_248);
      }
      if ((((entersec._4_4_ & 2) != 0) &&
          (bVar5 = TAngle<double>::operator>(&this->bottompitch,0.0), bVar5)) &&
         (((open.top != -3.4028234663852886e+38 || (NAN(open.top))) &&
          (bVar5 = sector_t::PortalBlocksMovement(exitsec,0), psVar3 = exitsec, !bVar5)))) {
        dVar14 = in_00->frac;
        TAngle<double>::TAngle(&local_268,0.0);
        TAngle<double>::TAngle(&local_270,&this->toppitch);
        MAX<TAngle<double>>(&local_260,&local_268);
        TAngle<double>::TAngle(&local_278,&this->bottompitch);
        EnterSectorPortal(this,0,dVar14,psVar3,&local_260,&local_278);
      }
    }
    ac = (in_00->d).thing;
  } while ((ac == this->shootthing) ||
          ((this->aimtarget != (AActor *)0x0 && (ac != this->aimtarget))));
  iVar8 = (int)ac;
  if ((((this->flags & 8U) == 0) || (ac->Conversation == (FStrifeDialogueNode *)0x0)) &&
     ((this->flags & 4U) == 0)) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_27c,iVar8 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar7 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_27c);
    if (uVar7 == 0) goto LAB_00682555;
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_280,iVar8 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG))
    ;
    uVar7 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_280);
    bVar5 = false;
    if (((uVar7 != 0) && (bVar5 = false, this->shootthing->player != (player_t *)0x0)) &&
       (bVar5 = false, this->shootthing->player->ReadyWeapon != (AWeapon *)0x0)) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                ((TFlags<ActorFlag2,_unsigned_int> *)((long)&ff_top + 4),
                 (int)this->shootthing->player->ReadyWeapon + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar7 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&ff_top + 4));
      bVar5 = uVar7 != 0;
    }
    if (bVar5) goto LAB_00682555;
  }
  thingpitch.Degrees = this->attackrange * in_00->frac;
  bVar6 = FBoolCVar::operator_cast_to_bool(&cl_doautoaim);
  bVar5 = false;
  if (!bVar6) {
    TFlags<ActorFlag6,_unsigned_int>::operator&
              ((TFlags<ActorFlag6,_unsigned_int> *)&ff_top,
               iVar8 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
    uVar7 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&ff_top);
    bVar5 = uVar7 != 0;
  }
  if (!bVar5) {
    if ((this->lastsector == ac->Sector) &&
       (uVar7 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&ac->Sector->e->XFloor), uVar7 != 0)) {
      if (this->lastceilingplane != (secplane_t *)0x0) {
        pitch_1.Degrees = secplane_t::ZatPoint(this->lastceilingplane,ac);
        VecToAngle(thingpitch.Degrees,pitch_1.Degrees - this->shootz);
        TAngle<double>::operator-(&local_298);
        TAngle<double>::TAngle((TAngle<double> *)&ff_bottom,&this->toppitch);
        bVar5 = TAngle<double>::operator>(&local_298,(TAngle<double> *)&ff_bottom);
        if (bVar5) {
          TAngle<double>::operator=(&this->toppitch,&local_298);
        }
      }
      if (this->lastfloorplane != (secplane_t *)0x0) {
        pitch_2.Degrees = secplane_t::ZatPoint(this->lastfloorplane,ac);
        VecToAngle(thingpitch.Degrees,pitch_2.Degrees - this->shootz);
        TAngle<double>::operator-(&local_2b8);
        TAngle<double>::TAngle(local_2c8,&this->bottompitch);
        bVar5 = TAngle<double>::operator<(&local_2b8,local_2c8);
        if (bVar5) {
          TAngle<double>::operator=(&this->bottompitch,&local_2b8);
        }
      }
    }
    DVar4.Degrees = thingpitch.Degrees;
    dVar14 = AActor::Top(ac);
    VecToAngle(DVar4.Degrees,dVar14 - this->shootz);
    TAngle<double>::operator-(&local_2d0);
    TAngle<double>::operator=(&thingbottompitch,&local_2d0);
    TAngle<double>::TAngle(local_2e0,&this->bottompitch);
    bVar5 = TAngle<double>::operator>(&thingbottompitch,local_2e0);
    DVar4 = thingpitch;
    if (!bVar5) {
      dVar14 = AActor::Z(ac);
      VecToAngle(DVar4.Degrees,dVar14 - this->shootz);
      TAngle<double>::operator-(&local_2e8);
      TAngle<double>::operator=((TAngle<double> *)&dist,&local_2e8);
      TAngle<double>::TAngle(local_2f8,&this->toppitch);
      bVar5 = TAngle<double>::operator<((TAngle<double> *)&dist,local_2f8);
      if (!bVar5) {
        if ((((this->crossedffloors & 1U) == 0) || ((this->unlinked & 1U) != 0)) ||
           (bVar5 = P_CheckSight(this->shootthing,ac,9), bVar5)) {
          TAngle<double>::TAngle(&local_328,&this->toppitch);
          bVar5 = TAngle<double>::operator<(&thingbottompitch,&local_328);
          if (bVar5) {
            TAngle<double>::operator=(&thingbottompitch,&this->toppitch);
          }
          TAngle<double>::TAngle(&local_330,&this->bottompitch);
          bVar5 = TAngle<double>::operator>((TAngle<double> *)&dist,&local_330);
          if (bVar5) {
            TAngle<double>::operator=((TAngle<double> *)&dist,&this->bottompitch);
          }
          TAngle<double>::operator/(&local_340,2.0);
          TAngle<double>::operator/((TAngle<double> *)&cosine,2.0);
          TAngle<double>::operator+(&local_338,&local_340);
          TAngle<double>::operator=((TAngle<double> *)&frontflag,&local_338);
          if ((this->flags & 2U) != 0) {
            tracelen = TAngle<double>::Cos((TAngle<double> *)&frontflag);
            if ((tracelen != 0.0) || (NAN(tracelen))) {
              pdVar11 = FPathTraverse::Trace((FPathTraverse *)&in);
              dVar14 = pdVar11->dx;
              pdVar11 = FPathTraverse::Trace((FPathTraverse *)&in);
              TVector2<double>::TVector2((TVector2<double> *)&d3,dVar14,pdVar11->dy);
              local_358 = TVector2<double>::Length((TVector2<double> *)&d3);
              local_370 = (local_358 * in_00->frac) / tracelen;
              if (this->attackrange <= local_370 && local_370 != this->attackrange)
              goto LAB_00683dcd;
            }
          }
          if ((((this->flags & 0x10U) == 0) || (bVar5 = AActor::IsFriend(ac,this->friender), !bVar5)
              ) || (this->aimtarget != (AActor *)0x0)) {
            iVar9 = FIntCVar::operator_cast_to_int(&sv_smartaim);
            if (((iVar9 == 0) || ((this->flags & 1U) != 0)) || (this->aimtarget != (AActor *)0x0)) {
              bVar5 = FBoolCVar::operator_cast_to_bool(&aimdebug);
              if (bVar5) {
                pMVar12 = AActor::GetClass(ac);
                pcVar13 = FName::GetChars(&(pMVar12->super_PClass).super_PStruct.super_PNamedType.
                                           TypeName);
                dVar14 = AActor::X(ac);
                dVar15 = AActor::Y(ac);
                dVar16 = AActor::Z(ac);
                Printf("Hit target %s at %f,%f,%f\n",dVar14,dVar15,dVar16,pcVar13);
              }
              dVar14 = in_00->frac;
              TAngle<double>::TAngle(&local_398,(TAngle<double> *)&frontflag);
              SetResult(this,&this->linetarget,dVar14,ac,&local_398);
              goto LAB_00683dcd;
            }
            bVar5 = AActor::IsFriend(ac,this->friender);
            if (bVar5) {
              iVar8 = FIntCVar::operator_cast_to_int(&sv_smartaim);
              if (iVar8 < 2) {
                bVar5 = FBoolCVar::operator_cast_to_bool(&aimdebug);
                if (bVar5) {
                  pMVar12 = AActor::GetClass(ac);
                  pcVar13 = FName::GetChars(&(pMVar12->super_PClass).super_PStruct.super_PNamedType.
                                             TypeName);
                  dVar14 = AActor::X(ac);
                  dVar15 = AActor::Y(ac);
                  dVar16 = AActor::Z(ac);
                  Printf("Hit friend %s at %f,%f,%f\n",dVar14,dVar15,dVar16,pcVar13);
                }
                dVar14 = in_00->frac;
                TAngle<double>::TAngle(&local_378,(TAngle<double> *)&frontflag);
                SetResult(this,&this->thing_friend,dVar14,ac,&local_378);
              }
            }
            else {
              TFlags<ActorFlag3,_unsigned_int>::operator&
                        (&local_37c,
                         iVar8 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
              uVar7 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_37c);
              bVar5 = false;
              if (uVar7 == 0) {
                bVar5 = ac->player == (player_t *)0x0;
              }
              if (!bVar5) {
                bVar5 = FBoolCVar::operator_cast_to_bool(&aimdebug);
                if (bVar5) {
                  pMVar12 = AActor::GetClass(ac);
                  pcVar13 = FName::GetChars(&(pMVar12->super_PClass).super_PStruct.super_PNamedType.
                                             TypeName);
                  dVar14 = AActor::X(ac);
                  dVar15 = AActor::Y(ac);
                  dVar16 = AActor::Z(ac);
                  Printf("Hit target %s at %f,%f,%f\n",dVar14,dVar15,dVar16,pcVar13);
                }
                dVar14 = in_00->frac;
                TAngle<double>::TAngle(&local_390,(TAngle<double> *)&frontflag);
                SetResult(this,&this->linetarget,dVar14,ac,&local_390);
                goto LAB_00683dcd;
              }
              iVar8 = FIntCVar::operator_cast_to_int(&sv_smartaim);
              if (iVar8 < 3) {
                bVar5 = FBoolCVar::operator_cast_to_bool(&aimdebug);
                if (bVar5) {
                  pMVar12 = AActor::GetClass(ac);
                  pcVar13 = FName::GetChars(&(pMVar12->super_PClass).super_PStruct.super_PNamedType.
                                             TypeName);
                  dVar14 = AActor::X(ac);
                  dVar15 = AActor::Y(ac);
                  dVar16 = AActor::Z(ac);
                  Printf("Hit other %s at %f,%f,%f\n",dVar14,dVar15,dVar16,pcVar13);
                }
                dVar14 = in_00->frac;
                TAngle<double>::TAngle(&local_388,(TAngle<double> *)&frontflag);
                SetResult(this,&this->thing_other,dVar14,ac,&local_388);
              }
            }
          }
        }
        else {
          TAngle<double>::TAngle(&local_300,&this->toppitch);
          bVar5 = TAngle<double>::operator<(&thingbottompitch,&local_300);
          if (bVar5) {
            TAngle<double>::TAngle(&local_308,&this->toppitch);
            bVar5 = TAngle<double>::operator>((TAngle<double> *)&dist,&local_308);
            if (bVar5) {
              TAngle<double>::operator=(&this->toppitch,(TAngle<double> *)&dist);
            }
          }
          else {
            TAngle<double>::TAngle(&local_310,&this->bottompitch);
            bVar5 = TAngle<double>::operator>((TAngle<double> *)&dist,&local_310);
            if (bVar5) {
              TAngle<double>::TAngle(&local_318,&this->bottompitch);
              bVar5 = TAngle<double>::operator<(&thingbottompitch,&local_318);
              if (bVar5) {
                TAngle<double>::operator=(&this->bottompitch,&thingbottompitch);
              }
            }
          }
          TAngle<double>::TAngle(&local_320,&this->bottompitch);
          bVar5 = TAngle<double>::operator<(&this->toppitch,&local_320);
          if (!bVar5) {
LAB_00683dcd:
            FPathTraverse::~FPathTraverse((FPathTraverse *)&in);
            return;
          }
        }
      }
    }
  }
  goto LAB_00682555;
}

Assistant:

void AimTraverse()
	{
		// for smart aiming
		linetarget.Clear();
		thing_friend.Clear();
		thing_other.Clear();
		crossedffloors = lastsector->e->XFloor.ffloors.Size() != 0;
		lastfloorplane = lastceilingplane = NULL;

		// check the initial sector for 3D-floors and portals
		bool ceilingportalstate = (aimdir & aim_t::aim_up) && toppitch < 0 && !lastsector->PortalBlocksMovement(sector_t::ceiling);
		bool floorportalstate = (aimdir & aim_t::aim_down) && bottompitch > 0 && !lastsector->PortalBlocksMovement(sector_t::floor);

		for (auto rover : lastsector->e->XFloor.ffloors)
		{
			if ((rover->flags & FF_SHOOTTHROUGH) || !(rover->flags & FF_EXISTS)) continue;

			double bottomz = rover->bottom.plane->ZatPoint(startpos);

			if (bottomz >= startpos.Z + shootthing->Height)
			{
				lastceilingplane = rover->bottom.plane;
				// no ceiling portal if below a 3D floor
				ceilingportalstate = false;
			}

			bottomz = rover->top.plane->ZatPoint(startpos);
			if (bottomz <= startpos.Z)
			{
				lastfloorplane = rover->top.plane;
				// no floor portal if above a 3D floor
				floorportalstate = false;
			}
		}
		if (ceilingportalstate) EnterSectorPortal(sector_t::ceiling, 0, lastsector, toppitch, MIN<DAngle>(0., bottompitch));
		if (floorportalstate) EnterSectorPortal(sector_t::floor, 0, lastsector, MAX<DAngle>(0., toppitch), bottompitch);

		FPathTraverse it(startpos.X, startpos.Y, aimtrace.X, aimtrace.Y, PT_ADDLINES | PT_ADDTHINGS | PT_COMPATIBLE | PT_DELTA, startfrac);
		intercept_t *in;

		if (aimdebug)
			Printf("Start AimTraverse, start = %f,%f,%f, vect = %f,%f\n",
				startpos.X / 65536., startpos.Y / 65536., startpos.Z / 65536.,
				aimtrace.X / 65536., aimtrace.Y / 65536.);
		
		while ((in = it.Next()))
		{
			line_t* 			li;
			AActor* 			th;
			DAngle	 			pitch;
			DAngle				thingtoppitch;
			DAngle 				thingbottompitch;
			double 				dist;
			DAngle				thingpitch;

			if (linetarget.linetarget != NULL && in->frac > linetarget.frac) return;	// we already found something better in another portal section.

			if (in->isaline)
			{
				li = in->d.line;
				int frontflag = P_PointOnLineSidePrecise(startpos, li);

				if (aimdebug)
					Printf("Found line %d: ___toppitch = %f, ___bottompitch = %f\n", int(li - lines), toppitch.Degrees, bottompitch.Degrees);

				if (li->isLinePortal() && frontflag == 0)
				{
					EnterLinePortal(li, in->frac);
					return;
				}


				if (!(li->flags & ML_TWOSIDED) || (li->flags & ML_BLOCKEVERYTHING))
					return;				// stop

				// Crosses a two sided line.
				// A two sided line will restrict the possible target ranges.
				FLineOpening open;
				P_LineOpening(open, NULL, li, it.InterceptPoint(in), (DVector2*)nullptr, FFCF_NODROPOFF);

				// The following code assumes that portals on the front of the line have already been processed.

				if (open.range <= 0 || open.bottom >= open.top)
					return;
					
				dist = attackrange * in->frac;

				if (open.bottom != LINEOPEN_MIN)
				{
					pitch = -VecToAngle(dist, open.bottom - shootz);
					if (pitch < bottompitch) bottompitch = pitch;
				}

				if (open.top != LINEOPEN_MAX)
				{
					pitch = -VecToAngle(dist, open.top - shootz);
					if (pitch > toppitch) toppitch = pitch;
				}

				if (toppitch >= bottompitch)
					return;

				int planestocheck;
				if (!AimTraverse3DFloors(it.Trace(), in, frontflag, &planestocheck))
					return;

				if (aimdebug)
					Printf("After line %d: toppitch = %f, bottompitch = %f, planestocheck = %d\n", int(li - lines), toppitch.Degrees, bottompitch.Degrees, planestocheck);

				sector_t *entersec = frontflag ? li->frontsector : li->backsector;
				sector_t *exitsec = frontflag ? li->backsector : li->frontsector;
				lastsector = entersec;
				// check portal in backsector when aiming up/downward is possible, the line doesn't have portals on both sides and there's actually a portal in the backsector
				if ((planestocheck & aim_up) && toppitch < 0 && open.top != LINEOPEN_MAX && !entersec->PortalBlocksMovement(sector_t::ceiling))
				{
					EnterSectorPortal(sector_t::ceiling, in->frac, entersec, toppitch, MIN<DAngle>(0., bottompitch));
				}
				if ((planestocheck & aim_down) && bottompitch > 0 && open.bottom != LINEOPEN_MIN && !entersec->PortalBlocksMovement(sector_t::floor))
				{
					EnterSectorPortal(sector_t::floor, in->frac, entersec, MAX<DAngle>(0., toppitch), bottompitch);
				}
				continue;					// shot continues
			}

			// shoot a thing
			th = in->d.thing;
			if (th == shootthing)
				continue;					// can't shoot self

			if (aimtarget != NULL && th != aimtarget)
				continue;					// only care about target, and you're not it

			// If we want to start a conversation anything that has one should be
			// found, regardless of other settings.
			if (!(flags & ALF_CHECKCONVERSATION) || th->Conversation == NULL)
			{
				if (!(flags & ALF_CHECKNONSHOOTABLE))			// For info CCMD, ignore stuff about GHOST and SHOOTABLE flags
				{
					if (!(th->flags&MF_SHOOTABLE))
						continue;					// corpse or something

					// check for physical attacks on a ghost
					if ((th->flags3 & MF3_GHOST) &&
						shootthing->player &&	// [RH] Be sure shootthing is a player
						shootthing->player->ReadyWeapon &&
						(shootthing->player->ReadyWeapon->flags2 & MF2_THRUGHOST))
					{
						continue;
					}
				}
			}
			dist = attackrange * in->frac;

			// Don't autoaim certain special actors
			if (!cl_doautoaim && th->flags6 & MF6_NOTAUTOAIMED)
			{
				continue;
			}

			// we must do one last check whether the trace has crossed a 3D floor
			if (lastsector == th->Sector && th->Sector->e->XFloor.ffloors.Size())
			{
				if (lastceilingplane)
				{
					double ff_top = lastceilingplane->ZatPoint(th);
					DAngle pitch = -VecToAngle(dist, ff_top - shootz);
					// upper slope intersects with this 3d-floor
					if (pitch > toppitch)
					{
						toppitch = pitch;
					}
				}
				if (lastfloorplane)
				{
					double ff_bottom = lastfloorplane->ZatPoint(th);
					DAngle pitch = -VecToAngle(dist, ff_bottom - shootz);
					// lower slope intersects with this 3d-floor
					if (pitch < bottompitch)
					{
						bottompitch = pitch;
					}
				}
			}

			// check angles to see if the thing can be aimed at

			thingtoppitch = -VecToAngle(dist, th->Top() - shootz);

			if (thingtoppitch > bottompitch)
				continue;					// shot over the thing

			thingbottompitch = -VecToAngle(dist, th->Z() - shootz);

			if (thingbottompitch < toppitch)
				continue;					// shot under the thing

			if (crossedffloors)
			{
				// if 3D floors were in the way do an extra visibility check for safety
				if (!unlinked && !P_CheckSight(shootthing, th, SF_IGNOREVISIBILITY | SF_IGNOREWATERBOUNDARY))
				{
					// the thing can't be seen so we can safely exclude its range from our aiming field
					if (thingtoppitch < toppitch)
					{
						if (thingbottompitch > toppitch) toppitch = thingbottompitch;
					}
					else if (thingbottompitch>bottompitch)
					{
						if (thingtoppitch < bottompitch) bottompitch = thingtoppitch;
					}
					if (toppitch < bottompitch) continue;
					else return;
				}
			}

			// this thing can be hit!
			if (thingtoppitch < toppitch)
				thingtoppitch = toppitch;

			if (thingbottompitch > bottompitch)
				thingbottompitch = bottompitch;

			thingpitch = thingtoppitch / 2 + thingbottompitch / 2;

			if (flags & ALF_CHECK3D)
			{
				// We need to do a 3D distance check here because this is nearly always used in
				// combination with P_LineAttack. P_LineAttack uses 3D distance but FPathTraverse
				// only 2D. This causes some problems with Hexen's weapons that use different
				// attack modes based on distance to target
				double cosine = thingpitch.Cos();
				if (cosine != 0)
				{
					double tracelen = DVector2(it.Trace().dx, it.Trace().dy).Length();
					double d3 = tracelen * in->frac / cosine;
					if (d3 > attackrange)
					{
						return;
					}
				}
			}

			if ((flags & ALF_NOFRIENDS) && th->IsFriend(friender) && aimtarget == NULL)
			{
				continue;
			}
			else if (sv_smartaim != 0 && !(flags & ALF_FORCENOSMART) && aimtarget == NULL)
			{
				// try to be a little smarter about what to aim at!
				// In particular avoid autoaiming at friends and barrels.
				if (th->IsFriend(friender))
				{
					if (sv_smartaim < 2)
					{
						// friends don't aim at friends (except players), at least not first
						if (aimdebug)
							Printf("Hit friend %s at %f,%f,%f\n", th->GetClass()->TypeName.GetChars(), th->X(), th->Y(), th->Z());
						SetResult(thing_friend, in->frac, th, thingpitch);
					}
				}
				else if (!(th->flags3 & MF3_ISMONSTER) && th->player == NULL)
				{
					if (sv_smartaim < 3)
					{
						// don't autoaim at barrels and other shootable stuff unless no monsters have been found
						if (aimdebug)
							Printf("Hit other %s at %f,%f,%f\n", th->GetClass()->TypeName.GetChars(), th->X(), th->Y(), th->Z());
						SetResult(thing_other, in->frac, th, thingpitch);
					}
				}
				else
				{
					if (aimdebug)
						Printf("Hit target %s at %f,%f,%f\n", th->GetClass()->TypeName.GetChars(), th->X(), th->Y(), th->Z());
					SetResult(linetarget, in->frac, th, thingpitch);
					return;
				}
			}
			else
			{
				if (aimdebug)
					Printf("Hit target %s at %f,%f,%f\n", th->GetClass()->TypeName.GetChars(), th->X(), th->Y(), th->Z());
				SetResult(linetarget, in->frac, th, thingpitch);
				return;
			}
		}
	}